

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_encoder.h
# Opt level: O3

exr_result_t
LossyDctEncoder_base_construct
          (LossyDctEncoder *e,float quantBaseError,uint8_t *packedAc,uint8_t *packedDc,
          uint16_t *toNonlinear,int width,int height)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar9;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint uVar16;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  uint uVar17;
  uint uVar23;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  uint uVar24;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  long lVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  int iVar44;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  uint uVar45;
  uint uVar50;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  uint uVar54;
  uint uVar59;
  uint uVar60;
  uint uVar61;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  uint uVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  uint uVar73;
  undefined1 in_XMM15 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float local_28;
  
  e->_quantBaseError = quantBaseError;
  e->_width = width;
  e->_height = height;
  e->_toNonlinear = toNonlinear;
  e->_numAcComp = 0;
  e->_numDcComp = 0;
  e->_packedAc = packedAc;
  e->_packedDc = packedDc;
  auVar5 = ZEXT816(0);
  local_28 = quantBaseError;
  if (quantBaseError < 0.0) {
    e->_quantBaseError = 0.0;
    local_28 = 0.0;
  }
  lVar2 = -0x80;
  lVar3 = 0;
  do {
    auVar18._0_4_ = (float)*(int *)(&DAT_00175680 + lVar3) * local_28;
    auVar18._4_4_ = (float)*(int *)(&UNK_00175684 + lVar3) * local_28;
    auVar18._8_4_ = (float)*(int *)(&UNK_00175688 + lVar3) * local_28;
    auVar18._12_4_ = (float)*(int *)(&UNK_0017568c + lVar3) * local_28;
    auVar19 = divps(auVar18,_DAT_001754c0);
    *(undefined1 (*) [16])((long)e->_quantTableY + lVar3) = auVar19;
    uVar16 = auVar19._12_4_;
    uVar54 = auVar19._0_4_ & 0x7fffffff;
    uVar59 = auVar19._4_4_ & 0x7fffffff;
    uVar24 = auVar19._8_4_;
    uVar60 = uVar24 & 0x7fffffff;
    uVar61 = uVar16 & 0x7fffffff;
    auVar10._0_4_ = auVar19._0_4_ >> 0x10;
    auVar10._4_4_ = auVar19._4_4_ >> 0x10;
    auVar10._8_4_ = uVar24 >> 0x10;
    auVar10._12_4_ = uVar16 >> 0x10;
    auVar5 = pshuflw(auVar5,auVar10,0xe8);
    auVar5 = pshufhw(auVar5,auVar5,0xe8);
    auVar68._4_4_ = auVar5._8_4_;
    auVar68._0_4_ = auVar5._0_4_;
    auVar68._8_4_ = auVar5._8_4_;
    auVar68._12_4_ = auVar5._12_4_;
    auVar36._0_4_ = -(uint)((int)(uVar54 | 0x80000000) < -0x4cffffff);
    auVar36._4_4_ = -(uint)((int)(uVar59 | 0x80000000) < -0x4cffffff);
    auVar36._8_4_ = -(uint)((int)(uVar60 | 0x80000000) < -0x4cffffff);
    auVar36._12_4_ = -(uint)((int)(uVar61 | 0x80000000) < -0x4cffffff);
    auVar51._0_4_ = -(uint)(-0x47800001 < (int)(uVar54 | 0x80000000));
    auVar51._4_4_ = -(uint)(-0x47800001 < (int)(uVar59 | 0x80000000));
    auVar51._8_4_ = -(uint)(-0x47800001 < (int)(uVar60 | 0x80000000));
    auVar51._12_4_ = -(uint)(-0x47800001 < (int)(uVar61 | 0x80000000));
    auVar32._0_4_ = 0x7e - (uVar54 >> 0x17);
    auVar32._4_4_ = 0x7e - (uVar59 >> 0x17);
    auVar32._8_4_ = 0x7e - (uVar60 >> 0x17);
    auVar32._12_4_ = 0x7e - (uVar61 >> 0x17);
    auVar20._0_8_ = auVar19._0_8_ & 0x7fffff007fffff;
    auVar20._8_4_ = uVar24 & 0x7fffff;
    auVar20._12_4_ = uVar16 & 0x7fffff;
    auVar51 = auVar51 ^ auVar36;
    auVar20 = auVar20 | _DAT_00175180;
    auVar25._0_4_ = (float)(((uVar54 >> 0x17) - 0x5e) * 0x800000 + 0x3f800000);
    auVar25._4_4_ = (float)(((uVar59 >> 0x17) - 0x5e) * 0x800000 + 0x3f800000);
    auVar25._8_4_ = (float)(((uVar60 >> 0x17) - 0x5e) * 0x800000 + 0x3f800000);
    auVar25._12_4_ = (float)(((uVar61 >> 0x17) - 0x5e) * 0x800000 + 0x3f800000);
    iVar44 = (int)auVar25._4_4_;
    uVar17 = auVar20._0_4_;
    uVar23 = auVar20._4_4_;
    uVar16 = auVar20._8_4_;
    uVar24 = auVar20._12_4_;
    auVar37 = packssdw(auVar36,auVar36);
    auVar5 = pshuflw(auVar25,auVar32,0xfe);
    lVar35 = auVar5._0_8_;
    auVar46._0_4_ = uVar17 >> lVar35;
    auVar46._4_4_ = uVar23 >> lVar35;
    auVar46._8_4_ = uVar16 >> lVar35;
    auVar46._12_4_ = uVar24 >> lVar35;
    auVar64._4_4_ = uVar23;
    auVar64._0_4_ = uVar23;
    auVar64._8_4_ = uVar24;
    auVar64._12_4_ = uVar24;
    auVar5 = pshuflw(in_XMM15,auVar32,0x54);
    auVar26._0_4_ = uVar17 >> auVar5._0_8_;
    auVar71._4_4_ = iVar44;
    auVar71._0_4_ = iVar44;
    auVar71._8_4_ = (int)auVar25._12_4_;
    auVar71._12_4_ = (int)auVar25._12_4_;
    auVar70._4_4_ = auVar32._12_4_;
    auVar70._0_4_ = auVar32._8_4_;
    auVar70._8_4_ = auVar32._8_4_;
    auVar70._12_4_ = auVar32._12_4_;
    auVar5 = pshuflw(auVar46,auVar70,0xfe);
    lVar35 = auVar5._0_8_;
    auVar39._0_4_ = uVar17 >> lVar35;
    auVar39._4_4_ = uVar23 >> lVar35;
    auVar39._8_4_ = uVar16 >> lVar35;
    auVar39._12_4_ = uVar24 >> lVar35;
    auVar5 = pshuflw(auVar70,auVar70,0x54);
    uVar62 = (uint)((auVar20._8_8_ & 0xffffffff) * (ulong)(uint)(int)auVar25._8_4_);
    auVar26._4_4_ = auVar46._4_4_;
    auVar26._8_4_ = uVar16 >> auVar5._0_8_;
    auVar26._12_4_ = auVar39._12_4_;
    auVar5 = pshuflw(auVar5,auVar26,0xe8);
    uVar73 = (uint)((auVar71._8_8_ & 0xffffffff) * (ulong)uVar24);
    auVar5 = pshufhw(auVar5,auVar5,0xe8);
    auVar19 = pshuflw(auVar39,auVar10 & _DAT_001751b0,0xe8);
    auVar65 = pshufhw(auVar64,auVar19,0xe8);
    auVar65 = auVar65 | auVar5;
    auVar26 = auVar26 & _DAT_00135070;
    auVar27._0_4_ = -(uint)(auVar26._0_4_ == 0);
    auVar27._4_4_ = -(uint)(auVar26._4_4_ == 0);
    auVar27._8_4_ = -(uint)(auVar26._8_4_ == 0);
    auVar27._12_4_ = -(uint)(auVar26._12_4_ == 0);
    auVar31._0_4_ = -(uint)(-0x80000000 < (int)(uVar17 * (int)auVar25._0_4_));
    auVar31._4_4_ = -(uint)(-0x80000000 < (int)(iVar44 * uVar23));
    auVar31._8_4_ = -(uint)(-0x80000000 < (int)uVar62);
    auVar31._12_4_ = -(uint)(-0x80000000 < (int)uVar73);
    uVar16 = uVar54 + 0xc7800000 ^ 0x80000000;
    uVar24 = uVar59 + 0xc7800000 ^ 0x80000000;
    uVar45 = uVar60 + 0xc7800000 ^ 0x80000000;
    uVar50 = uVar61 + 0xc7800000 ^ 0x80000000;
    auVar40._0_4_ = uVar54 >> 0xd;
    auVar40._4_4_ = uVar59 >> 0xd;
    auVar40._8_4_ = uVar60 >> 0xd;
    auVar40._12_4_ = uVar61 >> 0xd;
    auVar5 = auVar40 & _DAT_00135070;
    auVar66._0_4_ = -(uint)((int)uVar16 < 0x7a800001);
    auVar66._4_4_ = -(uint)((int)uVar24 < 0x7a800001);
    auVar66._8_4_ = -(uint)((int)uVar45 < 0x7a800001);
    auVar66._12_4_ = -(uint)((int)uVar50 < 0x7a800001);
    auVar6._0_4_ = -(uint)(-0x71001001 < (int)uVar16);
    auVar6._4_4_ = -(uint)(-0x71001001 < (int)uVar24);
    auVar6._8_4_ = -(uint)(-0x71001001 < (int)uVar45);
    auVar6._12_4_ = -(uint)(-0x71001001 < (int)uVar50);
    auVar47._0_4_ = -(uint)(0 < (int)(uVar17 * (int)auVar25._0_4_ ^ 0x80000000));
    auVar47._4_4_ = -(uint)(0 < (int)(iVar44 * uVar23 ^ 0x80000000));
    auVar47._8_4_ = -(uint)(0 < (int)(uVar62 ^ 0x80000000));
    auVar47._12_4_ = -(uint)(0 < (int)(uVar73 ^ 0x80000000));
    auVar7 = packssdw(auVar6,auVar6);
    auVar72._0_4_ = uVar54 + 0x8000fff + auVar5._0_4_ >> 0xd;
    auVar72._4_4_ = uVar59 + 0x8000fff + auVar5._4_4_ >> 0xd;
    auVar72._8_4_ = uVar60 + 0x8000fff + auVar5._8_4_ >> 0xd;
    auVar72._12_4_ = uVar61 + 0x8000fff + auVar5._12_4_ >> 0xd;
    auVar5 = pshuflw(auVar5,auVar72 | auVar10 & _DAT_001751b0,0xe8);
    auVar5 = pshufhw(auVar5,auVar5,0xe8);
    auVar40 = auVar40 & _DAT_00175230;
    auVar19._0_4_ = -(uint)(auVar40._0_4_ == 0);
    auVar19._4_4_ = -(uint)(auVar40._4_4_ == 0);
    auVar19._8_4_ = -(uint)(auVar40._8_4_ == 0);
    auVar19._12_4_ = -(uint)(auVar40._12_4_ == 0);
    auVar19 = packssdw(auVar19,auVar19);
    auVar41 = packssdw(auVar40,auVar40);
    auVar33._8_4_ = 0xffffffff;
    auVar33._0_8_ = 0xffffffffffffffff;
    auVar33._12_4_ = 0xffffffff;
    auVar4._0_4_ = -(uint)(-0x47fff001 < (int)(uVar54 + 0xb8801000 ^ 0x80000000));
    auVar4._4_4_ = -(uint)(-0x47fff001 < (int)(uVar59 + 0xb8801000 ^ 0x80000000));
    auVar4._8_4_ = -(uint)(-0x47fff001 < (int)(uVar60 + 0xb8801000 ^ 0x80000000));
    auVar4._12_4_ = -(uint)(-0x47fff001 < (int)(uVar61 + 0xb8801000 ^ 0x80000000));
    auVar4 = packssdw(auVar4,auVar4);
    auVar52 = ~auVar51 & auVar47 | (auVar51 | auVar47 | auVar27 | auVar31) ^ auVar33;
    uVar1 = SUB168(auVar68 & _DAT_00175120,0) | (ulong)DAT_00175210;
    auVar21 = ~(auVar51 | auVar47) & (auVar27 | auVar31);
    auVar55._0_4_ = -(uint)(uVar54 == 0x7f800000);
    auVar55._4_4_ = -(uint)(uVar59 == 0x7f800000);
    auVar55._8_4_ = -(uint)(uVar60 == 0x7f800000);
    auVar55._12_4_ = -(uint)(uVar61 == 0x7f800000);
    auVar56 = packssdw(auVar55,auVar55);
    auVar28._0_2_ = auVar65._0_2_ + 1;
    auVar28._2_2_ = auVar65._2_2_ + 1;
    auVar28._4_2_ = auVar65._8_2_ + 1;
    auVar28._6_2_ = auVar65._10_2_ + 1;
    auVar28._8_2_ = auVar65._8_2_ + 1;
    auVar28._10_2_ = auVar65._10_2_ + 1;
    auVar28._12_2_ = auVar65._12_2_ + 1;
    auVar28._14_2_ = auVar65._14_2_ + 1;
    auVar21 = packssdw(auVar21,auVar21);
    auVar21 = psllw(auVar21,0xf);
    auVar21 = psraw(auVar21,0xf);
    auVar52 = packssdw(auVar52,auVar52);
    auVar52 = psllw(auVar52,0xf);
    auVar52 = psraw(auVar52,0xf);
    auVar69 = auVar68 & _DAT_00175120 & auVar37;
    *(ulong *)((long)e->_quantTableCbCr + lVar2) =
         ~auVar21._0_8_ &
         (~auVar52._0_8_ &
          (~auVar37._0_8_ &
           (~auVar56._0_8_ &
            (~auVar7._0_8_ & CONCAT44(auVar5._8_4_,auVar5._0_4_) |
            ((auVar41._0_8_ |
              CONCAT26(auVar19._6_2_ >> 0xf,
                       CONCAT24(auVar19._4_2_ >> 0xf,
                                CONCAT22(auVar19._2_2_ >> 0xf,auVar19._0_2_ >> 0xf))) | uVar1) &
             auVar4._0_8_ | ~auVar4._0_8_ & uVar1) & auVar7._0_8_) | uVar1 & auVar56._0_8_) |
          auVar69._0_8_) | SUB168(auVar28 & auVar52,0)) |
         CONCAT44(auVar65._8_4_,auVar65._0_4_) & auVar21._0_8_;
    auVar11._0_4_ = (float)*(int *)(&DAT_00175780 + lVar3) * local_28;
    auVar11._4_4_ = (float)*(int *)(&UNK_00175784 + lVar3) * local_28;
    auVar11._8_4_ = (float)*(int *)(&UNK_00175788 + lVar3) * local_28;
    auVar11._12_4_ = (float)*(int *)(&UNK_0017578c + lVar3) * local_28;
    auVar19 = divps(auVar11,_DAT_001754e0);
    auVar66 = auVar66 | auVar51 ^ auVar33;
    *(undefined1 (*) [16])((long)e->_quantTableCbCr + lVar3) = auVar19;
    uVar16 = auVar19._12_4_;
    uVar62 = auVar19._0_4_ & 0x7fffffff;
    uVar54 = auVar19._4_4_ & 0x7fffffff;
    uVar24 = auVar19._8_4_;
    uVar59 = uVar24 & 0x7fffffff;
    uVar60 = uVar16 & 0x7fffffff;
    auVar42._0_4_ = auVar19._0_4_ >> 0x10;
    auVar42._4_4_ = auVar19._4_4_ >> 0x10;
    auVar42._8_4_ = uVar24 >> 0x10;
    auVar42._12_4_ = uVar16 >> 0x10;
    auVar5 = pshuflw(auVar51 ^ auVar33,auVar42,0xe8);
    uVar45 = uVar62 | 0x80000000;
    uVar50 = uVar54 | 0x80000000;
    uVar17 = uVar59 | 0x80000000;
    uVar23 = uVar60 | 0x80000000;
    auVar22._0_4_ = -(uint)(-0x47800001 < (int)uVar45);
    auVar22._4_4_ = -(uint)(-0x47800001 < (int)uVar50);
    auVar22._8_4_ = -(uint)(-0x47800001 < (int)uVar17);
    auVar22._12_4_ = -(uint)(-0x47800001 < (int)uVar23);
    auVar7._0_4_ = 0x7e - (uVar62 >> 0x17);
    auVar7._4_4_ = 0x7e - (uVar54 >> 0x17);
    auVar7._8_4_ = 0x7e - (uVar59 >> 0x17);
    auVar7._12_4_ = 0x7e - (uVar60 >> 0x17);
    auVar12._0_8_ = auVar19._0_8_ & 0x7fffff007fffff;
    auVar12._8_4_ = uVar24 & 0x7fffff;
    auVar12._12_4_ = uVar16 & 0x7fffff;
    auVar12 = auVar12 | _DAT_00175180;
    auVar4 = pshuflw(auVar28 & auVar52,auVar7,0xfe);
    auVar19 = pshuflw(auVar4,auVar7,0x54);
    auVar57._0_4_ = auVar12._0_4_ >> auVar19._0_8_;
    auVar21._4_4_ = auVar7._12_4_;
    auVar21._0_4_ = auVar7._8_4_;
    auVar21._8_4_ = auVar7._8_4_;
    auVar21._12_4_ = auVar7._12_4_;
    auVar7 = pshuflw(auVar19,auVar21,0xfe);
    iVar44 = (int)(float)(((uVar54 >> 0x17) - 0x5e) * 0x800000 + 0x3f800000);
    iVar9 = (int)(float)(((uVar60 >> 0x17) - 0x5e) * 0x800000 + 0x3f800000);
    auVar29._0_8_ =
         (ulong)auVar12._0_4_ *
         (ulong)(uint)(int)(float)(((uVar62 >> 0x17) - 0x5e) * 0x800000 + 0x3f800000);
    auVar29._8_8_ =
         (auVar12._8_8_ & 0xffffffff) *
         (ulong)(uint)(int)(float)(((uVar59 >> 0x17) - 0x5e) * 0x800000 + 0x3f800000);
    auVar34._4_4_ = iVar44;
    auVar34._0_4_ = iVar44;
    auVar34._8_4_ = iVar9;
    auVar34._12_4_ = iVar9;
    uVar16 = iVar44 * auVar12._4_4_;
    lVar35 = (auVar34._8_8_ & 0xffffffff) * (ulong)auVar12._12_4_;
    auVar38._0_4_ = -(uint)((int)uVar45 < -0x4cffffff);
    auVar38._4_4_ = -(uint)((int)uVar50 < -0x4cffffff);
    auVar38._8_4_ = -(uint)((int)uVar17 < -0x4cffffff);
    auVar38._12_4_ = -(uint)((int)uVar23 < -0x4cffffff);
    auVar19 = pshuflw(auVar21,auVar21,0x54);
    in_XMM15 = ~auVar22 & auVar66;
    auVar57._4_4_ = auVar12._4_4_ >> auVar4._0_8_;
    auVar57._8_4_ = auVar12._8_4_ >> auVar19._0_8_;
    auVar57._12_4_ = auVar12._12_4_ >> auVar7._0_8_;
    uVar24 = (uint)lVar35;
    auVar13._4_4_ = uVar24;
    auVar13._0_4_ = uVar16;
    auVar13._8_4_ = uVar24;
    auVar13._12_4_ = (int)((ulong)lVar35 >> 0x20);
    auVar19 = pshuflw(auVar29,auVar57,0xe8);
    auVar4 = pshufhw(auVar19,auVar19,0xe8);
    auVar19 = pshuflw(auVar13,auVar42 & _DAT_001751b0,0xe8);
    auVar70 = pshufhw(auVar69,auVar19,0xe8);
    auVar70 = auVar70 | auVar4;
    auVar30._0_4_ = -(uint)(0 < (int)((uint)auVar29._0_8_ ^ 0x80000000));
    auVar30._4_4_ = -(uint)(0 < (int)(uVar16 ^ 0x80000000));
    auVar30._8_4_ = -(uint)(0 < (int)((uint)auVar29._8_8_ ^ 0x80000000));
    auVar30._12_4_ = -(uint)(0 < (int)(uVar24 ^ 0x80000000));
    auVar37._0_4_ = -(uint)(-0x80000000 < (int)(uint)auVar29._0_8_);
    auVar37._4_4_ = -(uint)(-0x80000000 < (int)uVar16);
    auVar37._8_4_ = -(uint)(-0x80000000 < (int)(uint)auVar29._8_8_);
    auVar37._12_4_ = -(uint)(-0x80000000 < (int)uVar24);
    auVar57 = auVar57 & _DAT_00135070;
    auVar58._0_4_ = -(uint)(auVar57._0_4_ == 0);
    auVar58._4_4_ = -(uint)(auVar57._4_4_ == 0);
    auVar58._8_4_ = -(uint)(auVar57._8_4_ == 0);
    auVar58._12_4_ = -(uint)(auVar57._12_4_ == 0);
    auVar22 = auVar22 & auVar66;
    auVar53._0_4_ = uVar62 >> 0xd;
    auVar53._4_4_ = uVar54 >> 0xd;
    auVar53._8_4_ = uVar59 >> 0xd;
    auVar53._12_4_ = uVar60 >> 0xd;
    auVar32 = ~auVar30 & ~auVar38 & in_XMM15;
    auVar19 = auVar53 & _DAT_00135070;
    auVar48._0_4_ = -(uint)(-0x38801001 < (int)uVar45);
    auVar48._4_4_ = -(uint)(-0x38801001 < (int)uVar50);
    auVar48._8_4_ = -(uint)(-0x38801001 < (int)uVar17);
    auVar48._12_4_ = -(uint)(-0x38801001 < (int)uVar23);
    auVar41._0_4_ = -(uint)(-0x800001 < (int)uVar45);
    auVar41._4_4_ = -(uint)(-0x800001 < (int)uVar50);
    auVar41._8_4_ = -(uint)(-0x800001 < (int)uVar17);
    auVar41._12_4_ = -(uint)(-0x800001 < (int)uVar23);
    auVar67._0_4_ = uVar62 + 0x8000fff + auVar19._0_4_ >> 0xd;
    auVar67._4_4_ = uVar54 + 0x8000fff + auVar19._4_4_ >> 0xd;
    auVar67._8_4_ = uVar59 + 0x8000fff + auVar19._8_4_ >> 0xd;
    auVar67._12_4_ = uVar60 + 0x8000fff + auVar19._12_4_ >> 0xd;
    auVar19 = ~auVar41 & auVar22;
    auVar7 = ~auVar48 & auVar19;
    auVar53 = auVar53 & _DAT_00175230;
    auVar52._0_4_ = -(uint)(auVar53._0_4_ == 0);
    auVar52._4_4_ = -(uint)(auVar53._4_4_ == 0);
    auVar52._8_4_ = -(uint)(auVar53._8_4_ == 0);
    auVar52._12_4_ = -(uint)(auVar53._12_4_ == 0);
    auVar4 = packssdw(auVar52,auVar52);
    auVar41 = packssdw(auVar53,auVar53);
    auVar56._0_2_ = auVar4._0_2_ >> 0xf;
    auVar56._2_2_ = auVar4._2_2_ >> 0xf;
    auVar56._4_2_ = auVar4._4_2_ >> 0xf;
    auVar56._6_2_ = auVar4._6_2_ >> 0xf;
    auVar56._8_2_ = auVar4._8_2_ >> 0xf;
    auVar56._10_2_ = auVar4._10_2_ >> 0xf;
    auVar56._12_2_ = auVar4._12_2_ >> 0xf;
    auVar56._14_2_ = auVar4._14_2_ >> 0xf;
    auVar5 = pshufhw(auVar56,auVar5,0xe8);
    auVar43._4_4_ = auVar5._8_4_;
    auVar43._0_4_ = auVar5._0_4_;
    auVar43._8_4_ = auVar5._8_4_;
    auVar43._12_4_ = auVar5._12_4_;
    auVar5 = pshuflw(auVar5,auVar48 & auVar19,0xe8);
    auVar5 = pshufhw(auVar5,auVar5,0xe8);
    auVar63._0_4_ = -(uint)(uVar62 == 0x7f800000);
    auVar63._4_4_ = -(uint)(uVar54 == 0x7f800000);
    auVar63._8_4_ = -(uint)(uVar59 == 0x7f800000);
    auVar63._12_4_ = -(uint)(uVar60 == 0x7f800000);
    auVar49._4_4_ = auVar5._8_4_;
    auVar49._0_4_ = auVar5._0_4_;
    auVar49._8_4_ = auVar5._8_4_;
    auVar49._12_4_ = auVar5._12_4_;
    auVar63 = auVar63 & auVar22;
    auVar21 = auVar43 & _DAT_00175120 | _DAT_00175210;
    auVar5 = psllw(auVar49,0xf);
    auVar4 = psraw(auVar5,0xf);
    auVar5 = pshuflw(auVar21 & auVar4,auVar7,0xe8);
    auVar5 = pshufhw(auVar5,auVar5,0xe8);
    auVar65._0_4_ = auVar5._0_4_;
    auVar65._8_4_ = auVar5._8_4_;
    auVar65._12_4_ = auVar5._12_4_;
    auVar65._4_4_ = auVar65._8_4_;
    auVar5 = psllw(auVar65,0xf);
    auVar5 = psraw(auVar5,0xf);
    auVar19 = pshuflw(auVar7,auVar67 | auVar42 & _DAT_001751b0,0xe8);
    auVar19 = pshufhw(auVar19,auVar19,0xe8);
    auVar8._0_4_ = auVar19._0_4_;
    auVar8._8_4_ = auVar19._8_4_;
    auVar8._12_4_ = auVar19._12_4_;
    auVar8._4_4_ = auVar8._8_4_;
    auVar19 = ~auVar5 & (~auVar4 & (auVar41 | auVar56 | auVar21) | auVar21 & auVar4) |
              auVar8 & auVar5;
    auVar5 = packssdw(auVar63,auVar63);
    auVar5 = psllw(auVar5,0xf);
    auVar52 = psraw(auVar5,0xf);
    auVar5 = packssdw(auVar38 & in_XMM15,auVar38 & in_XMM15);
    auVar5 = psllw(auVar5,0xf);
    auVar41 = psraw(auVar5,0xf);
    auVar5 = pshuflw(auVar19,auVar30 & ~auVar38 & in_XMM15 | ~(auVar58 | auVar37) & auVar32,0xe8);
    auVar4 = pshufhw(auVar5,auVar5,0xe8);
    auVar5._4_4_ = auVar70._8_4_;
    auVar5._0_4_ = auVar70._0_4_;
    auVar5._8_4_ = auVar70._8_4_;
    auVar5._12_4_ = auVar70._12_4_;
    auVar69._0_4_ = auVar4._0_4_;
    auVar69._8_4_ = auVar4._8_4_;
    auVar69._12_4_ = auVar4._12_4_;
    auVar69._4_4_ = auVar69._8_4_;
    auVar4 = psllw(auVar69,0xf);
    auVar4 = psraw(auVar4,0xf);
    auVar14._0_2_ = auVar70._0_2_ + 1;
    auVar14._2_2_ = auVar70._2_2_ + 1;
    auVar14._4_2_ = auVar70._8_2_ + 1;
    auVar14._6_2_ = auVar70._10_2_ + 1;
    auVar14._8_2_ = auVar70._8_2_ + 1;
    auVar14._10_2_ = auVar70._10_2_ + 1;
    auVar14._12_2_ = auVar70._12_2_ + 1;
    auVar14._14_2_ = auVar70._14_2_ + 1;
    auVar7 = pshuflw(auVar14 & auVar4,(auVar58 | auVar37) & auVar32,0xe8);
    auVar7 = pshufhw(auVar7,auVar7,0xe8);
    auVar15._0_4_ = auVar7._0_4_;
    auVar15._8_4_ = auVar7._8_4_;
    auVar15._12_4_ = auVar7._12_4_;
    auVar15._4_4_ = auVar15._8_4_;
    auVar7 = psllw(auVar15,0xf);
    auVar7 = psraw(auVar7,0xf);
    auVar5 = auVar5 & auVar7;
    *(ulong *)((long)e[1]._channel_encode_data + lVar2 + -0x18) =
         ~auVar7._0_8_ &
         (~auVar4._0_8_ &
          (~auVar41._0_8_ & (~auVar52._0_8_ & auVar19._0_8_ | auVar21._0_8_ & auVar52._0_8_) |
          SUB168(auVar43 & _DAT_00175120,0) & auVar41._0_8_) | SUB168(auVar14 & auVar4,0)) |
         auVar5._0_8_;
    lVar3 = lVar3 + 0x10;
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0);
  *(undefined8 *)((long)e->_channel_encode_data + 0xc) = 0;
  *(undefined8 *)((long)e->_channel_encode_data + 0x14) = 0;
  e->_channel_encode_data[0] = (DctCoderChannelData *)0x0;
  e->_channel_encode_data[1] = (DctCoderChannelData *)0x0;
  return 0;
}

Assistant:

exr_result_t
LossyDctEncoder_base_construct (
    LossyDctEncoder* e,
    float            quantBaseError,
    uint8_t*         packedAc,
    uint8_t*         packedDc,
    const uint16_t*  toNonlinear,
    int              width,
    int              height)
{
    //
    // Here, we take the generic JPEG quantization tables and
    // normalize them by the smallest component in each table.
    // This gives us a relationship amongst the DCT components,
    // in terms of how sensitive each component is to
    // error.
    //
    // A higher normalized value means we can quantize more,
    // and a small normalized value means we can quantize less.
    //
    // Eventually, we will want an acceptable quantization
    // error range for each component. We find this by
    // multiplying some user-specified level (_quantBaseError)
    // by the normalized table (_quantTableY, _quantTableCbCr) to
    // find the acceptable quantization error range.
    //
    // The quantization table is not needed for decoding, and
    // is not transmitted. So, if you want to get really fancy,
    // you could derive some content-dependent quantization
    // table, and the decoder would not need to be changed. But,
    // for now, we'll just use static quantization tables.
    //
    int jpegQuantTableY[] = {
        16, 11, 10, 16, 24,  40,  51,  61,  12, 12, 14, 19, 26,  58,  60,  55,
        14, 13, 16, 24, 40,  57,  69,  56,  14, 17, 22, 29, 51,  87,  80,  62,
        18, 22, 37, 56, 68,  109, 103, 77,  24, 35, 55, 64, 81,  104, 113, 92,
        49, 64, 78, 87, 103, 121, 120, 101, 72, 92, 95, 98, 112, 100, 103, 99};

    int jpegQuantTableYMin = 10;

    int jpegQuantTableCbCr[] = {
        17, 18, 24, 47, 99, 99, 99, 99, 18, 21, 26, 66, 99, 99, 99, 99,
        24, 26, 56, 99, 99, 99, 99, 99, 47, 66, 99, 99, 99, 99, 99, 99,
        99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99,
        99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99};

    int jpegQuantTableCbCrMin = 17;

    e->_quantBaseError = quantBaseError;
    e->_width          = width;
    e->_height         = height;
    e->_toNonlinear    = toNonlinear;
    e->_numAcComp      = 0;
    e->_numDcComp      = 0;
    e->_packedAc       = packedAc;
    e->_packedDc       = packedDc;
    if (e->_quantBaseError < 0) e->_quantBaseError = 0;

    for (int idx = 0; idx < 64; ++idx)
    {
        e->_quantTableY[idx] =
            (e->_quantBaseError * (float) (jpegQuantTableY[idx]) /
             (float) (jpegQuantTableYMin));
        e->_hquantTableY[idx] = float_to_half (e->_quantTableY[idx]);

        e->_quantTableCbCr[idx] =
            (e->_quantBaseError * (float) (jpegQuantTableCbCr[idx]) /
             (float) (jpegQuantTableCbCrMin));
        e->_hquantTableCbCr[idx] = float_to_half (e->_quantTableCbCr[idx]);
    }

    e->_channel_encode_data[0]    = NULL;
    e->_channel_encode_data[1]    = NULL;
    e->_channel_encode_data[2]    = NULL;
    e->_channel_encode_data_count = 0;

    return EXR_ERR_SUCCESS;
}